

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::JobManager::PrepareStopJobs
          (Error *__return_storage_ptr__,JobManager *this,Expression *aExpr,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *aNids,bool aGroupAlias)

{
  _Rb_tree_header *p_Var1;
  ErrorCode EVar2;
  ulong *puVar3;
  ulong uVar4;
  uint64_t uVar5;
  string *psVar6;
  char cVar7;
  int iVar8;
  _Base_ptr p_Var9;
  _Alloc_hider _Var10;
  _Base_ptr p_Var11;
  ulong *puVar12;
  string local_98;
  string local_78;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  undefined1 local_48 [8];
  char local_40 [16];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  utils::ToLower((string *)local_58,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
  iVar8 = std::__cxx11::string::compare(local_58);
  if ((undefined1 *)CONCAT44(local_58._4_4_,local_58._0_4_) != local_48) {
    operator_delete((undefined1 *)CONCAT44(local_58._4_4_,local_58._0_4_));
  }
  if (iVar8 != 0) {
    __assert_fail("condition",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager.cpp"
                  ,0x105,
                  "Error ot::commissioner::JobManager::PrepareStopJobs(const Interpreter::Expression &, const std::vector<uint64_t> &, bool)"
                 );
  }
  puVar12 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar3 = (aNids->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar12 != puVar3) {
    p_Var1 = &(this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var9 = (this->mCommissionerPool)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      if (p_Var9 == (_Base_ptr)0x0) {
LAB_00281c30:
        if (!aGroupAlias) {
          uVar5 = *puVar12;
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"not known to be started","");
          WarningMsg(this,uVar5,&local_78);
          psVar6 = &local_78;
          _Var10._M_p = local_78._M_dataplus._M_p;
LAB_00281c7b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var10._M_p != &psVar6->field_2) {
            operator_delete(_Var10._M_p);
          }
        }
      }
      else {
        uVar4 = *puVar12;
        p_Var11 = &p_Var1->_M_header;
        do {
          if (*(ulong *)(p_Var9 + 1) >= uVar4) {
            p_Var11 = p_Var9;
          }
          p_Var9 = (&p_Var9->_M_left)[*(ulong *)(p_Var9 + 1) < uVar4];
        } while (p_Var9 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var11 == p_Var1) ||
           (uVar4 < ((_Rb_tree_header *)p_Var11)->_M_node_count)) goto LAB_00281c30;
        cVar7 = (**(code **)(**(long **)((long)p_Var11 + 0x28) + 0x78))();
        if (cVar7 == '\0') {
          if (aGroupAlias) goto LAB_00281cf6;
          uVar5 = *puVar12;
          local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"already stopped","");
          InfoMsg(this,uVar5,&local_98);
          psVar6 = &local_98;
          _Var10._M_p = local_98._M_dataplus._M_p;
          goto LAB_00281c7b;
        }
        CreateJob((Error *)local_58,this,(CommissionerAppPtr *)((long)p_Var11 + 0x28),aExpr,*puVar12
                 );
        __return_storage_ptr__->mCode = local_58._0_4_;
        std::__cxx11::string::operator=
                  ((string *)&__return_storage_ptr__->mMessage,(string *)&local_50);
        EVar2 = __return_storage_ptr__->mCode;
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        if (EVar2 != kNone) {
          return __return_storage_ptr__;
        }
      }
LAB_00281cf6:
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareStopJobs(const Interpreter::Expression &aExpr,
                                  const std::vector<uint64_t>   &aNids,
                                  bool                           aGroupAlias)
{
    Error error = ERROR_NONE;

    ASSERT(utils::ToLower(aExpr[0]) == "stop");

    for (const auto &nid : aNids)
    {
        auto entry = mCommissionerPool.find(nid);
        if (entry == mCommissionerPool.end())
        {
            if (!aGroupAlias)
            {
                WarningMsg(nid, "not known to be started");
            }
            continue;
        }

        bool active = entry->second->IsActive();
        if (!active)
        {
            if (!aGroupAlias)
            {
                InfoMsg(nid, "already stopped");
            }
            continue;
        }

        SuccessOrExit(error = CreateJob(entry->second, aExpr, nid));
    }
exit:
    return error;
}